

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::emit_fixup(CompilerMSL *this)

{
  string *ts;
  bool bVar1;
  
  bVar1 = Compiler::is_vertex_like_shader((Compiler *)this);
  if ((((bVar1) && ((this->stage_out_var_id).id != 0)) &&
      ((this->qual_pos_var_name)._M_string_length != 0)) &&
     (this->capture_output_to_buffer == false)) {
    ts = &this->qual_pos_var_name;
    if ((this->super_CompilerGLSL).options.vertex.fixup_clipspace == true) {
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[48]>
                (&this->super_CompilerGLSL,ts,(char (*) [7])".z = (",ts,(char (*) [6])".z + ",ts,
                 (char (*) [48])".w) * 0.5;       // Adjust clip-space for Metal");
    }
    if ((this->super_CompilerGLSL).options.vertex.flip_vert_y == true) {
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[8],std::__cxx11::string&,char_const(&)[5],char_const(&)[31]>
                (&this->super_CompilerGLSL,ts,(char (*) [8])".y = -(",ts,(char (*) [5])0x2d6a60,
                 (char (*) [31])"    // Invert Y-axis for Metal");
      return;
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_fixup()
{
	if (is_vertex_like_shader() && stage_out_var_id && !qual_pos_var_name.empty() && !capture_output_to_buffer)
	{
		if (options.vertex.fixup_clipspace)
			statement(qual_pos_var_name, ".z = (", qual_pos_var_name, ".z + ", qual_pos_var_name,
			          ".w) * 0.5;       // Adjust clip-space for Metal");

		if (options.vertex.flip_vert_y)
			statement(qual_pos_var_name, ".y = -(", qual_pos_var_name, ".y);", "    // Invert Y-axis for Metal");
	}
}